

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImVec4 *pIVar1;
  ImVec2 IVar2;
  char cVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  ImGuiTableColumn *pIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ImVec2 IVar32;
  ImVec2 IVar33;
  ImGuiContext *pIVar34;
  int iVar35;
  ImS8 *pIVar36;
  long lVar37;
  int iVar38;
  ImGuiTableCellData *pIVar39;
  long lVar40;
  int iVar41;
  ImGuiTableCellData *pIVar42;
  int iVar43;
  ImU32 col;
  ImU32 col_00;
  uint uVar44;
  uint uVar45;
  long lVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar59;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  long lVar58;
  float fVar60;
  float fVar61;
  float fVar64;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar67;
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar84;
  undefined1 auVar82 [16];
  int iVar85;
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  int iVar99;
  int iVar103;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  ImVec2 local_88;
  ImVec2 local_80;
  ImU32 local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined1 local_68 [16];
  ImVec2 local_50;
  undefined1 local_48 [16];
  long lVar65;
  
  pIVar34 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar34->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  fVar60 = table->RowPosY2;
  auVar47 = ZEXT416((uint)fVar60);
  (pIVar4->DC).CursorPos.y = fVar60;
  fVar64 = table->RowPosY1;
  auVar48 = ZEXT416((uint)fVar64);
  iVar35 = table->CurrentRow;
  if (iVar35 == 0) {
    table->LastFirstRowHeight = fVar60 - fVar64;
  }
  iVar38 = iVar35 + 1;
  iVar41 = (int)table->FreezeRowsCount;
  iVar43 = (int)table->FreezeRowsRequest;
  if (((table->InnerClipRect).Min.y <= fVar60) && (fVar64 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    local_74 = iVar43;
    local_68 = auVar47;
    local_48 = auVar48;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
      iVar35 = table->CurrentRow;
    }
    col = table->RowBgColor[1];
    local_78 = 0;
    if (col == 0x1000000) {
      col = 0;
    }
    if (((0 < iVar35) || (table->InnerWindow == table->OuterWindow)) &&
       (local_78 = 0, (table->Flags & 0x80) != 0)) {
      local_78 = table->RowBgColor[(ulong)((table->field_0x9a & 1) == 0) + 2];
    }
    cVar3 = table->RowCellDataCurrent;
    local_70 = iVar41;
    local_6c = iVar38;
    if ((-1 < cVar3 || iVar38 == iVar41) || (local_78 != 0 || (col != 0 || col_00 != 0))) {
      if ((table->Flags & 0x100000) == 0) {
        fVar60 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar64 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar67 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar5 = pIVar4->DrawList;
        (pIVar5->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar5->_CmdHeader).ClipRect.y = fVar60;
        (pIVar5->_CmdHeader).ClipRect.z = fVar64;
        (pIVar5->_CmdHeader).ClipRect.w = fVar67;
      }
      ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar4->DrawList,0);
    }
    if (col != 0 || col_00 != 0) {
      IVar2 = (table->BgClipRect).Min;
      fVar60 = (table->WorkRect).Min.x;
      fVar64 = IVar2.x;
      fVar67 = IVar2.y;
      uVar44 = -(uint)(fVar64 <= fVar60);
      uVar45 = -(uint)(fVar67 <= (float)local_48._0_4_);
      local_88.x = (float)(~uVar44 & (uint)fVar64 | (uint)fVar60 & uVar44);
      local_88.y = (float)(~uVar45 & (uint)fVar67 | local_48._0_4_ & uVar45);
      auVar48._8_8_ = 0;
      auVar48._0_4_ = (table->BgClipRect).Max.x;
      auVar48._4_4_ = (table->BgClipRect).Max.y;
      auVar47._4_4_ = local_68._0_4_;
      auVar47._0_4_ = (table->WorkRect).Max.x;
      auVar47._8_4_ = 0;
      auVar47._12_4_ = local_68._4_4_;
      auVar47 = minps(auVar47,auVar48);
      local_80 = auVar47._0_8_;
      if ((col_00 != 0) && (local_88.y < auVar47._4_4_)) {
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_88,&local_80,col_00,0.0,0);
      }
      if ((col != 0) && (local_88.y < local_80.y)) {
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_88,&local_80,col,0.0,0);
      }
    }
    if ((-1 < cVar3) && (-1 < (long)table->RowCellDataCurrent)) {
      pIVar39 = (table->RowCellData).Data;
      pIVar42 = pIVar39 + table->RowCellDataCurrent;
      do {
        cVar3 = pIVar39->Column;
        pIVar6 = (table->Columns).Data;
        fVar60 = (table->WorkRect).Min.x;
        uVar44 = -(uint)(fVar60 <= pIVar6[cVar3].MinX);
        fVar64 = (table->WorkRect).Max.x;
        fVar67 = pIVar6[cVar3].MaxX;
        if (fVar64 <= pIVar6[cVar3].MaxX) {
          fVar67 = fVar64;
        }
        fVar61 = (float)(~uVar44 & (uint)fVar60 | (uint)pIVar6[cVar3].MinX & uVar44);
        IVar2 = (table->BgClipRect).Min;
        auVar86._4_4_ = table->RowPosY2;
        auVar86._0_4_ = fVar67;
        auVar86._8_8_ = 0;
        fVar60 = IVar2.x;
        fVar64 = IVar2.y;
        uVar44 = -(uint)(fVar60 <= fVar61);
        uVar45 = -(uint)(fVar64 <= table->RowPosY1);
        fVar67 = (float)(~uVar44 & (uint)fVar60 | (uint)fVar61 & uVar44);
        local_88.y = (float)(~uVar45 & (uint)fVar64 | (uint)table->RowPosY1 & uVar45);
        auVar62._8_8_ = 0;
        auVar62._0_4_ = (table->BgClipRect).Max.x;
        auVar62._4_4_ = (table->BgClipRect).Max.y;
        auVar47 = minps(auVar86,auVar62);
        fVar60 = pIVar6[cVar3].ClipRect.Min.x;
        uVar44 = -(uint)(fVar60 <= fVar67);
        local_88.x = (float)(~uVar44 & (uint)fVar60 | (uint)fVar67 & uVar44);
        auVar82 = auVar47;
        if (pIVar6[cVar3].MaxX <= auVar47._0_4_) {
          auVar82._4_12_ = auVar47._4_12_;
          auVar82._0_4_ = pIVar6[cVar3].MaxX;
        }
        local_80.y = auVar47._4_4_;
        local_80.x = auVar82._0_4_;
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_88,&local_80,pIVar39->BgColor,0.0,0);
        pIVar39 = pIVar39 + 1;
      } while (pIVar39 <= pIVar42);
    }
    if (((local_78 != 0) && ((table->BgClipRect).Min.y <= (float)local_48._0_4_)) &&
       ((float)local_48._0_4_ < (table->BgClipRect).Max.y)) {
      local_88.x = table->BorderX1;
      local_88.y = (float)local_48._0_4_;
      local_50.x = table->BorderX2;
      local_50.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_88,&local_50,local_78,1.0);
    }
    iVar38 = local_6c;
    iVar41 = local_70;
    iVar43 = local_74;
    if (((local_6c == local_70) && ((table->BgClipRect).Min.y <= (float)local_68._0_4_)) &&
       ((float)local_68._0_4_ < (table->BgClipRect).Max.y)) {
      local_88.x = table->BorderX1;
      local_88.y = (float)local_68._0_4_;
      local_50.x = table->BorderX2;
      local_50.y = (float)local_68._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_88,&local_50,table->BorderColorStrong,1.0);
    }
  }
  auVar47 = _DAT_0017b730;
  if (iVar38 == iVar43) {
    iVar35 = table->ColumnsCount;
    if (0 < (long)iVar35) {
      lVar37 = (long)table->FreezeColumnsCount;
      lVar40 = (long)iVar35 + -1;
      local_68._8_4_ = (int)lVar40;
      local_68._0_8_ = lVar40;
      local_68._12_4_ = (int)((ulong)lVar40 >> 0x20);
      pIVar36 = &((table->Columns).Data)->NavLayerCurrent;
      lVar40 = 0xf;
      auVar48 = local_68;
      auVar63 = _DAT_001856a0;
      auVar66 = _DAT_001856b0;
      auVar68 = _DAT_001856c0;
      auVar69 = _DAT_001856d0;
      auVar70 = _DAT_001856e0;
      auVar71 = _DAT_001856f0;
      auVar72 = _DAT_00185700;
      auVar73 = _DAT_0017ec20;
      do {
        auVar82 = local_68 ^ auVar47;
        auVar86 = auVar73 ^ auVar47;
        iVar43 = auVar82._0_4_;
        iVar99 = -(uint)(iVar43 < auVar86._0_4_);
        iVar59 = auVar82._4_4_;
        auVar88._4_4_ = -(uint)(iVar59 < auVar86._4_4_);
        iVar84 = auVar82._8_4_;
        iVar103 = -(uint)(iVar84 < auVar86._8_4_);
        iVar85 = auVar82._12_4_;
        auVar88._12_4_ = -(uint)(iVar85 < auVar86._12_4_);
        auVar17._4_4_ = iVar99;
        auVar17._0_4_ = iVar99;
        auVar17._8_4_ = iVar103;
        auVar17._12_4_ = iVar103;
        auVar48 = pshuflw(auVar48,auVar17,0xe8);
        auVar87._4_4_ = -(uint)(auVar86._4_4_ == iVar59);
        auVar87._12_4_ = -(uint)(auVar86._12_4_ == iVar85);
        auVar87._0_4_ = auVar87._4_4_;
        auVar87._8_4_ = auVar87._12_4_;
        auVar86 = pshuflw(in_XMM11,auVar87,0xe8);
        auVar88._0_4_ = auVar88._4_4_;
        auVar88._8_4_ = auVar88._12_4_;
        auVar82 = pshuflw(auVar48,auVar88,0xe8);
        auVar49._8_4_ = 0xffffffff;
        auVar49._0_8_ = 0xffffffffffffffff;
        auVar49._12_4_ = 0xffffffff;
        auVar49 = (auVar82 | auVar86 & auVar48) ^ auVar49;
        auVar48 = packssdw(auVar49,auVar49);
        if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *pIVar36 = lVar40 + -0xf < lVar37;
        }
        auVar18._4_4_ = iVar99;
        auVar18._0_4_ = iVar99;
        auVar18._8_4_ = iVar103;
        auVar18._12_4_ = iVar103;
        auVar88 = auVar87 & auVar18 | auVar88;
        auVar48 = packssdw(auVar88,auVar88);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar48 = packssdw(auVar48 ^ auVar7,auVar48 ^ auVar7);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48._0_4_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar36 + 0x68) = lVar40 + -0xe < lVar37;
        }
        auVar48 = auVar72 ^ auVar47;
        auVar74._0_4_ = -(uint)(iVar43 < auVar48._0_4_);
        auVar74._4_4_ = -(uint)(iVar59 < auVar48._4_4_);
        auVar74._8_4_ = -(uint)(iVar84 < auVar48._8_4_);
        auVar74._12_4_ = -(uint)(iVar85 < auVar48._12_4_);
        auVar89._4_4_ = auVar74._0_4_;
        auVar89._0_4_ = auVar74._0_4_;
        auVar89._8_4_ = auVar74._8_4_;
        auVar89._12_4_ = auVar74._8_4_;
        iVar99 = -(uint)(auVar48._4_4_ == iVar59);
        iVar103 = -(uint)(auVar48._12_4_ == iVar85);
        auVar19._4_4_ = iVar99;
        auVar19._0_4_ = iVar99;
        auVar19._8_4_ = iVar103;
        auVar19._12_4_ = iVar103;
        auVar100._4_4_ = auVar74._4_4_;
        auVar100._0_4_ = auVar74._4_4_;
        auVar100._8_4_ = auVar74._12_4_;
        auVar100._12_4_ = auVar74._12_4_;
        auVar48 = auVar19 & auVar89 | auVar100;
        auVar48 = packssdw(auVar48,auVar48);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar48 = packssdw(auVar48 ^ auVar8,auVar48 ^ auVar8);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48._0_4_ >> 0x10 & 1) != 0) {
          *(bool *)((long)pIVar36 + 0xd0) = lVar40 + -0xd < lVar37;
        }
        auVar48 = pshufhw(auVar48,auVar89,0x84);
        auVar20._4_4_ = iVar99;
        auVar20._0_4_ = iVar99;
        auVar20._8_4_ = iVar103;
        auVar20._12_4_ = iVar103;
        auVar86 = pshufhw(auVar74,auVar20,0x84);
        auVar82 = pshufhw(auVar48,auVar100,0x84);
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar50 = (auVar82 | auVar86 & auVar48) ^ auVar50;
        auVar48 = packssdw(auVar50,auVar50);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48._0_4_ >> 0x18 & 1) != 0) {
          *(bool *)((long)pIVar36 + 0x138) = lVar40 + -0xc < lVar37;
        }
        auVar48 = auVar71 ^ auVar47;
        auVar75._0_4_ = -(uint)(iVar43 < auVar48._0_4_);
        auVar75._4_4_ = -(uint)(iVar59 < auVar48._4_4_);
        auVar75._8_4_ = -(uint)(iVar84 < auVar48._8_4_);
        auVar75._12_4_ = -(uint)(iVar85 < auVar48._12_4_);
        auVar21._4_4_ = auVar75._0_4_;
        auVar21._0_4_ = auVar75._0_4_;
        auVar21._8_4_ = auVar75._8_4_;
        auVar21._12_4_ = auVar75._8_4_;
        auVar86 = pshuflw(auVar100,auVar21,0xe8);
        auVar51._0_4_ = -(uint)(auVar48._0_4_ == iVar43);
        auVar51._4_4_ = -(uint)(auVar48._4_4_ == iVar59);
        auVar51._8_4_ = -(uint)(auVar48._8_4_ == iVar84);
        auVar51._12_4_ = -(uint)(auVar48._12_4_ == iVar85);
        auVar90._4_4_ = auVar51._4_4_;
        auVar90._0_4_ = auVar51._4_4_;
        auVar90._8_4_ = auVar51._12_4_;
        auVar90._12_4_ = auVar51._12_4_;
        auVar48 = pshuflw(auVar51,auVar90,0xe8);
        auVar91._4_4_ = auVar75._4_4_;
        auVar91._0_4_ = auVar75._4_4_;
        auVar91._8_4_ = auVar75._12_4_;
        auVar91._12_4_ = auVar75._12_4_;
        auVar82 = pshuflw(auVar75,auVar91,0xe8);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar48 = packssdw(auVar48 & auVar86,(auVar82 | auVar48 & auVar86) ^ auVar9);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar36 + 0x1a0) = lVar40 + -0xb < lVar37;
        }
        auVar22._4_4_ = auVar75._0_4_;
        auVar22._0_4_ = auVar75._0_4_;
        auVar22._8_4_ = auVar75._8_4_;
        auVar22._12_4_ = auVar75._8_4_;
        auVar91 = auVar90 & auVar22 | auVar91;
        auVar82 = packssdw(auVar91,auVar91);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar48 = packssdw(auVar48,auVar82 ^ auVar10);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48._4_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar36 + 0x208) = lVar40 + -10 < lVar37;
        }
        auVar48 = auVar70 ^ auVar47;
        auVar76._0_4_ = -(uint)(iVar43 < auVar48._0_4_);
        auVar76._4_4_ = -(uint)(iVar59 < auVar48._4_4_);
        auVar76._8_4_ = -(uint)(iVar84 < auVar48._8_4_);
        auVar76._12_4_ = -(uint)(iVar85 < auVar48._12_4_);
        auVar92._4_4_ = auVar76._0_4_;
        auVar92._0_4_ = auVar76._0_4_;
        auVar92._8_4_ = auVar76._8_4_;
        auVar92._12_4_ = auVar76._8_4_;
        iVar99 = -(uint)(auVar48._4_4_ == iVar59);
        iVar103 = -(uint)(auVar48._12_4_ == iVar85);
        auVar23._4_4_ = iVar99;
        auVar23._0_4_ = iVar99;
        auVar23._8_4_ = iVar103;
        auVar23._12_4_ = iVar103;
        auVar101._4_4_ = auVar76._4_4_;
        auVar101._0_4_ = auVar76._4_4_;
        auVar101._8_4_ = auVar76._12_4_;
        auVar101._12_4_ = auVar76._12_4_;
        auVar48 = auVar23 & auVar92 | auVar101;
        auVar48 = packssdw(auVar48,auVar48);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar48 = packssdw(auVar48 ^ auVar11,auVar48 ^ auVar11);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar36 + 0x270) = lVar40 + -9 < lVar37;
        }
        auVar48 = pshufhw(auVar48,auVar92,0x84);
        auVar24._4_4_ = iVar99;
        auVar24._0_4_ = iVar99;
        auVar24._8_4_ = iVar103;
        auVar24._12_4_ = iVar103;
        auVar86 = pshufhw(auVar76,auVar24,0x84);
        auVar82 = pshufhw(auVar48,auVar101,0x84);
        auVar52._8_4_ = 0xffffffff;
        auVar52._0_8_ = 0xffffffffffffffff;
        auVar52._12_4_ = 0xffffffff;
        auVar52 = (auVar82 | auVar86 & auVar48) ^ auVar52;
        auVar48 = packssdw(auVar52,auVar52);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48._6_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar36 + 0x2d8) = lVar40 + -8 < lVar37;
        }
        auVar48 = auVar69 ^ auVar47;
        auVar77._0_4_ = -(uint)(iVar43 < auVar48._0_4_);
        auVar77._4_4_ = -(uint)(iVar59 < auVar48._4_4_);
        auVar77._8_4_ = -(uint)(iVar84 < auVar48._8_4_);
        auVar77._12_4_ = -(uint)(iVar85 < auVar48._12_4_);
        auVar25._4_4_ = auVar77._0_4_;
        auVar25._0_4_ = auVar77._0_4_;
        auVar25._8_4_ = auVar77._8_4_;
        auVar25._12_4_ = auVar77._8_4_;
        auVar86 = pshuflw(auVar101,auVar25,0xe8);
        auVar53._0_4_ = -(uint)(auVar48._0_4_ == iVar43);
        auVar53._4_4_ = -(uint)(auVar48._4_4_ == iVar59);
        auVar53._8_4_ = -(uint)(auVar48._8_4_ == iVar84);
        auVar53._12_4_ = -(uint)(auVar48._12_4_ == iVar85);
        auVar93._4_4_ = auVar53._4_4_;
        auVar93._0_4_ = auVar53._4_4_;
        auVar93._8_4_ = auVar53._12_4_;
        auVar93._12_4_ = auVar53._12_4_;
        auVar48 = pshuflw(auVar53,auVar93,0xe8);
        auVar94._4_4_ = auVar77._4_4_;
        auVar94._0_4_ = auVar77._4_4_;
        auVar94._8_4_ = auVar77._12_4_;
        auVar94._12_4_ = auVar77._12_4_;
        auVar82 = pshuflw(auVar77,auVar94,0xe8);
        auVar78._8_4_ = 0xffffffff;
        auVar78._0_8_ = 0xffffffffffffffff;
        auVar78._12_4_ = 0xffffffff;
        auVar78 = (auVar82 | auVar48 & auVar86) ^ auVar78;
        auVar82 = packssdw(auVar78,auVar78);
        auVar48 = packsswb(auVar48 & auVar86,auVar82);
        if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar36 + 0x340) = lVar40 + -7 < lVar37;
        }
        auVar26._4_4_ = auVar77._0_4_;
        auVar26._0_4_ = auVar77._0_4_;
        auVar26._8_4_ = auVar77._8_4_;
        auVar26._12_4_ = auVar77._8_4_;
        auVar94 = auVar93 & auVar26 | auVar94;
        auVar82 = packssdw(auVar94,auVar94);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar82 = packssdw(auVar82 ^ auVar12,auVar82 ^ auVar12);
        auVar48 = packsswb(auVar48,auVar82);
        if ((auVar48._8_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar36 + 0x3a8) = lVar40 + -6 < lVar37;
        }
        auVar48 = auVar68 ^ auVar47;
        auVar79._0_4_ = -(uint)(iVar43 < auVar48._0_4_);
        auVar79._4_4_ = -(uint)(iVar59 < auVar48._4_4_);
        auVar79._8_4_ = -(uint)(iVar84 < auVar48._8_4_);
        auVar79._12_4_ = -(uint)(iVar85 < auVar48._12_4_);
        auVar95._4_4_ = auVar79._0_4_;
        auVar95._0_4_ = auVar79._0_4_;
        auVar95._8_4_ = auVar79._8_4_;
        auVar95._12_4_ = auVar79._8_4_;
        iVar99 = -(uint)(auVar48._4_4_ == iVar59);
        iVar103 = -(uint)(auVar48._12_4_ == iVar85);
        auVar27._4_4_ = iVar99;
        auVar27._0_4_ = iVar99;
        auVar27._8_4_ = iVar103;
        auVar27._12_4_ = iVar103;
        auVar102._4_4_ = auVar79._4_4_;
        auVar102._0_4_ = auVar79._4_4_;
        auVar102._8_4_ = auVar79._12_4_;
        auVar102._12_4_ = auVar79._12_4_;
        auVar48 = auVar27 & auVar95 | auVar102;
        auVar48 = packssdw(auVar48,auVar48);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar48 = packssdw(auVar48 ^ auVar13,auVar48 ^ auVar13);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar36 + 0x410) = lVar40 + -5 < lVar37;
        }
        auVar48 = pshufhw(auVar48,auVar95,0x84);
        auVar28._4_4_ = iVar99;
        auVar28._0_4_ = iVar99;
        auVar28._8_4_ = iVar103;
        auVar28._12_4_ = iVar103;
        auVar86 = pshufhw(auVar79,auVar28,0x84);
        auVar82 = pshufhw(auVar48,auVar102,0x84);
        auVar54._8_4_ = 0xffffffff;
        auVar54._0_8_ = 0xffffffffffffffff;
        auVar54._12_4_ = 0xffffffff;
        auVar54 = (auVar82 | auVar86 & auVar48) ^ auVar54;
        auVar48 = packssdw(auVar54,auVar54);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48._10_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar36 + 0x478) = lVar40 + -4 < lVar37;
        }
        auVar48 = auVar66 ^ auVar47;
        auVar80._0_4_ = -(uint)(iVar43 < auVar48._0_4_);
        auVar80._4_4_ = -(uint)(iVar59 < auVar48._4_4_);
        auVar80._8_4_ = -(uint)(iVar84 < auVar48._8_4_);
        auVar80._12_4_ = -(uint)(iVar85 < auVar48._12_4_);
        auVar29._4_4_ = auVar80._0_4_;
        auVar29._0_4_ = auVar80._0_4_;
        auVar29._8_4_ = auVar80._8_4_;
        auVar29._12_4_ = auVar80._8_4_;
        auVar86 = pshuflw(auVar102,auVar29,0xe8);
        auVar55._0_4_ = -(uint)(auVar48._0_4_ == iVar43);
        auVar55._4_4_ = -(uint)(auVar48._4_4_ == iVar59);
        auVar55._8_4_ = -(uint)(auVar48._8_4_ == iVar84);
        auVar55._12_4_ = -(uint)(auVar48._12_4_ == iVar85);
        auVar96._4_4_ = auVar55._4_4_;
        auVar96._0_4_ = auVar55._4_4_;
        auVar96._8_4_ = auVar55._12_4_;
        auVar96._12_4_ = auVar55._12_4_;
        auVar48 = pshuflw(auVar55,auVar96,0xe8);
        auVar97._4_4_ = auVar80._4_4_;
        auVar97._0_4_ = auVar80._4_4_;
        auVar97._8_4_ = auVar80._12_4_;
        auVar97._12_4_ = auVar80._12_4_;
        auVar82 = pshuflw(auVar80,auVar97,0xe8);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        auVar48 = packssdw(auVar48 & auVar86,(auVar82 | auVar48 & auVar86) ^ auVar14);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar36 + 0x4e0) = lVar40 + -3 < lVar37;
        }
        auVar30._4_4_ = auVar80._0_4_;
        auVar30._0_4_ = auVar80._0_4_;
        auVar30._8_4_ = auVar80._8_4_;
        auVar30._12_4_ = auVar80._8_4_;
        auVar97 = auVar96 & auVar30 | auVar97;
        auVar82 = packssdw(auVar97,auVar97);
        auVar15._8_4_ = 0xffffffff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15._12_4_ = 0xffffffff;
        auVar48 = packssdw(auVar48,auVar82 ^ auVar15);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48._12_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar36 + 0x548) = lVar40 + -2 < lVar37;
        }
        auVar48 = auVar63 ^ auVar47;
        auVar81._0_4_ = -(uint)(iVar43 < auVar48._0_4_);
        auVar81._4_4_ = -(uint)(iVar59 < auVar48._4_4_);
        auVar81._8_4_ = -(uint)(iVar84 < auVar48._8_4_);
        auVar81._12_4_ = -(uint)(iVar85 < auVar48._12_4_);
        auVar98._4_4_ = auVar81._0_4_;
        auVar98._0_4_ = auVar81._0_4_;
        auVar98._8_4_ = auVar81._8_4_;
        auVar98._12_4_ = auVar81._8_4_;
        iVar43 = -(uint)(auVar48._4_4_ == iVar59);
        iVar59 = -(uint)(auVar48._12_4_ == iVar85);
        auVar83._4_4_ = iVar43;
        auVar83._0_4_ = iVar43;
        auVar83._8_4_ = iVar59;
        auVar83._12_4_ = iVar59;
        auVar56._4_4_ = auVar81._4_4_;
        auVar56._0_4_ = auVar81._4_4_;
        auVar56._8_4_ = auVar81._12_4_;
        auVar56._12_4_ = auVar81._12_4_;
        auVar56 = auVar83 & auVar98 | auVar56;
        auVar48 = packssdw(auVar56,auVar56);
        auVar16._8_4_ = 0xffffffff;
        auVar16._0_8_ = 0xffffffffffffffff;
        auVar16._12_4_ = 0xffffffff;
        auVar48 = packssdw(auVar48 ^ auVar16,auVar48 ^ auVar16);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar36 + 0x5b0) = lVar40 + -1 < lVar37;
        }
        auVar48 = pshufhw(auVar48,auVar98,0x84);
        auVar82 = pshufhw(auVar81,auVar83,0x84);
        in_XMM11 = auVar82 & auVar48;
        auVar31._4_4_ = auVar81._4_4_;
        auVar31._0_4_ = auVar81._4_4_;
        auVar31._8_4_ = auVar81._12_4_;
        auVar31._12_4_ = auVar81._12_4_;
        auVar48 = pshufhw(auVar48,auVar31,0x84);
        auVar57._8_4_ = 0xffffffff;
        auVar57._0_8_ = 0xffffffffffffffff;
        auVar57._12_4_ = 0xffffffff;
        auVar57 = (auVar48 | in_XMM11) ^ auVar57;
        auVar48 = packssdw(auVar57,auVar57);
        auVar48 = packsswb(auVar48,auVar48);
        if ((auVar48._14_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar36 + 0x618) = lVar40 < lVar37;
        }
        lVar46 = (long)DAT_00185710;
        lVar65 = auVar73._8_8_;
        auVar73._0_8_ = auVar73._0_8_ + lVar46;
        lVar58 = DAT_00185710._8_8_;
        auVar73._8_8_ = lVar65 + lVar58;
        lVar65 = auVar72._8_8_;
        auVar72._0_8_ = auVar72._0_8_ + lVar46;
        auVar72._8_8_ = lVar65 + lVar58;
        lVar65 = auVar71._8_8_;
        auVar71._0_8_ = auVar71._0_8_ + lVar46;
        auVar71._8_8_ = lVar65 + lVar58;
        lVar65 = auVar70._8_8_;
        auVar70._0_8_ = auVar70._0_8_ + lVar46;
        auVar70._8_8_ = lVar65 + lVar58;
        lVar65 = auVar69._8_8_;
        auVar69._0_8_ = auVar69._0_8_ + lVar46;
        auVar69._8_8_ = lVar65 + lVar58;
        lVar65 = auVar68._8_8_;
        auVar68._0_8_ = auVar68._0_8_ + lVar46;
        auVar68._8_8_ = lVar65 + lVar58;
        lVar65 = auVar66._8_8_;
        auVar66._0_8_ = auVar66._0_8_ + lVar46;
        auVar66._8_8_ = lVar65 + lVar58;
        lVar65 = auVar63._8_8_;
        auVar63._0_8_ = auVar63._0_8_ + lVar46;
        auVar63._8_8_ = lVar65 + lVar58;
        pIVar36 = pIVar36 + 0x680;
        lVar46 = lVar40 - (ulong)(iVar35 + 0xfU & 0xfffffff0);
        lVar40 = lVar40 + 0x10;
        auVar48 = _DAT_00185710;
      } while (lVar46 != -1);
    }
  }
  if (iVar38 == iVar41) {
    table->IsUnfrozenRows = true;
    fVar60 = table->RowPosY2;
    fVar64 = (pIVar4->InnerClipRect).Min.y;
    fVar67 = (pIVar4->InnerClipRect).Max.y;
    uVar44 = -(uint)(fVar64 <= fVar60 + 1.0);
    fVar64 = (float)(~uVar44 & (uint)fVar64 | (uint)(fVar60 + 1.0) & uVar44);
    if (fVar67 <= fVar64) {
      fVar64 = fVar67;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar64;
    (table->BgClipRect).Min.y = fVar64;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar67;
    (table->BgClipRect).Max.y = fVar67;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    fVar67 = table->RowPosY1;
    fVar61 = (fVar60 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (pIVar4->DC).CursorPos.y = fVar61;
    table->RowPosY2 = fVar61;
    table->RowPosY1 = fVar61 - (fVar60 - fVar67);
    iVar35 = table->ColumnsCount;
    pIVar6 = (table->Columns).Data;
    if (0 < (long)iVar35) {
      lVar37 = 0;
      do {
        (&pIVar6->DrawChannelCurrent)[lVar37] = (&pIVar6->DrawChannelUnfrozen)[lVar37];
        *(float *)((long)&(pIVar6->ClipRect).Min.y + lVar37) = fVar64;
        lVar37 = lVar37 + 0x68;
      } while ((long)iVar35 * 0x68 - lVar37 != 0);
    }
    IVar2 = (pIVar6->ClipRect).Min;
    IVar32 = (pIVar6->ClipRect).Max;
    IVar33 = (pIVar6->ClipRect).Max;
    (pIVar4->ClipRect).Min = (pIVar6->ClipRect).Min;
    (pIVar4->ClipRect).Max = IVar33;
    pIVar5 = pIVar4->DrawList;
    (pIVar5->_CmdHeader).ClipRect.x = IVar2.x;
    (pIVar5->_CmdHeader).ClipRect.y = IVar2.y;
    (pIVar5->_CmdHeader).ClipRect.z = IVar32.x;
    (pIVar5->_CmdHeader).ClipRect.w = IVar32.y;
    pIVar1 = (pIVar4->DrawList->_ClipRectStack).Data +
             (long)(pIVar4->DrawList->_ClipRectStack).Size + -1;
    pIVar1->x = IVar2.x;
    pIVar1->y = IVar2.y;
    pIVar1->z = IVar32.x;
    pIVar1->w = IVar32.y;
    ImDrawListSplitter::SetCurrentChannel
              (table->DrawSplitter,pIVar4->DrawList,
               (uint)((table->Columns).Data)->DrawChannelCurrent);
  }
  if ((table->field_0x98 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                // As we render the BG here we need to clip things (for layout we would not)
                // FIXME: This cancels the OuterPadding addition done by TableGetCellBgRect(), need to keep it while rendering correctly while scrolling.
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped when scrolling
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}